

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O3

void rw::d3d::rasterUnlock(Raster *raster,int32 level)

{
  raster->width = raster->originalWidth;
  raster->height = raster->originalHeight;
  raster->stride = raster->originalStride;
  raster->pixels = raster->originalPixels;
  *(byte *)&raster->privateFlags = (byte)raster->privateFlags & 0xf9;
  return;
}

Assistant:

void
rasterUnlock(Raster *raster, int32 level)
{
#if RW_D3D9
	D3dRaster *natras = GETD3DRASTEREXT(raster);
	IDirect3DSurface9 *surf = (IDirect3DSurface9*)natras->lockedSurf;
	surf->UnlockRect();
	surf->Release();
	natras->lockedSurf = nil;
#endif
	raster->width = raster->originalWidth;
	raster->height = raster->originalHeight;
	raster->stride = raster->originalStride;
	raster->pixels = raster->originalPixels;

	raster->privateFlags &= ~(Raster::PRIVATELOCK_READ|Raster::PRIVATELOCK_WRITE);
}